

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddErrorOrWarning
          (ErrorPrinter *this,string *filename,int line,int column,string *message,string *type,
          ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if ((this->format_ == ERROR_FORMAT_MSVS) && (this->tree_ != (DiskSourceTree *)0x0)) {
    bVar1 = DiskSourceTree::VirtualFileToDiskFile(this->tree_,filename,&local_50);
    if (bVar1) {
      filename = &local_50;
    }
  }
  std::operator<<(out,(string *)filename);
  if (line != -1) {
    if (this->format_ == ERROR_FORMAT_MSVS) {
      poVar2 = std::operator<<(out,"(");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,line + 1);
      poVar2 = std::operator<<(poVar2,") : ");
      poVar2 = std::operator<<(poVar2,(string *)type);
      pcVar3 = " in column=";
    }
    else {
      if (this->format_ != ERROR_FORMAT_GCC) goto LAB_0024308e;
      pcVar3 = ":";
      poVar2 = std::operator<<(out,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,line + 1);
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<((ostream *)poVar2,column + 1);
  }
LAB_0024308e:
  bVar1 = std::operator==(type,"warning");
  pcVar3 = ": ";
  if (bVar1) {
    pcVar3 = ": warning: ";
  }
  poVar2 = std::operator<<(out,pcVar3);
  poVar2 = std::operator<<(poVar2,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void AddErrorOrWarning(const string& filename, int line, int column,
                         const string& message, const string& type,
                         std::ostream& out) {
    // Print full path when running under MSVS
    string dfile;
    if (format_ == CommandLineInterface::ERROR_FORMAT_MSVS &&
        tree_ != NULL &&
        tree_->VirtualFileToDiskFile(filename, &dfile)) {
      out << dfile;
    } else {
      out << filename;
    }

    // Users typically expect 1-based line/column numbers, so we add 1
    // to each here.
    if (line != -1) {
      // Allow for both GCC- and Visual-Studio-compatible output.
      switch (format_) {
        case CommandLineInterface::ERROR_FORMAT_GCC:
          out << ":" << (line + 1) << ":" << (column + 1);
          break;
        case CommandLineInterface::ERROR_FORMAT_MSVS:
          out << "(" << (line + 1) << ") : "
              << type << " in column=" << (column + 1);
          break;
      }
    }

    if (type == "warning") {
      out << ": warning: " << message << std::endl;
    } else {
      out << ": " << message << std::endl;
    }
  }